

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O1

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  undefined1 *puVar1;
  curl_off_t *pcVar2;
  char cVar3;
  ulong uVar4;
  http_connect_state *phVar5;
  connectdata *pcVar6;
  uint uVar7;
  _Bool _Var8;
  CURLcode CVar9;
  int iVar10;
  CURLcode CVar11;
  CHUNKcode CVar12;
  int iVar13;
  http_connect_state *phVar14;
  char *pcVar15;
  timediff_t tVar16;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  size_t size;
  long lVar20;
  char *pcVar21;
  char *pcVar22;
  Curl_easy *data;
  bool bVar23;
  Curl_send_buffer *req_buffer;
  connectdata *local_a8;
  int *local_a0;
  int local_94;
  Curl_easy *local_90;
  char *local_88;
  uint local_7c;
  curl_off_t *local_78;
  curl_socket_t local_70;
  int subversion;
  long local_68;
  char *local_60;
  ssize_t tookcareof;
  char *local_50;
  curl_off_t *local_48;
  int *local_40;
  CURLcode extra;
  
  local_94 = sockindex;
  local_60 = hostname;
  if (conn->connect_state == (http_connect_state *)0x0) {
    phVar14 = (http_connect_state *)(*Curl_ccalloc)(1,0x4028);
    if (phVar14 == (http_connect_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_infof(conn->data,"allocate connect buffer!\n");
    conn->connect_state = phVar14;
    phVar14->tunnel_state = TUNNEL_INIT;
    phVar14->keepon = 1;
    phVar14->line_start = (char *)phVar14;
    phVar14->ptr = (char *)phVar14;
    phVar14->cl = 0;
    phVar14->field_0x4024 = phVar14->field_0x4024 & 0xfd;
  }
  subversion = 0;
  phVar14 = conn->connect_state;
  CVar11 = CURLE_OK;
  local_7c = remote_port;
  if ((phVar14 != (http_connect_state *)0x0) && (phVar14->tunnel_state != TUNNEL_COMPLETE)) {
    data = conn->data;
    local_68 = (long)local_94;
    local_70 = conn->sock[local_68];
    puVar1 = &(conn->bits).field_0x7;
    *puVar1 = *puVar1 & 0xfe;
    local_48 = &(data->info).request_size;
    local_40 = &phVar14->perline;
    local_a0 = &(data->req).httpcode;
    local_78 = &phVar14->cl;
    local_a8 = conn;
    local_90 = data;
    CVar11 = CURLE_OK;
    do {
      pcVar18 = local_60;
      uVar7 = local_7c;
      if (phVar14->tunnel_state == TUNNEL_INIT) {
        Curl_infof(data,"Establish HTTP proxy tunnel to %s:%d\n",local_60,(ulong)local_7c);
        (*Curl_cfree)((data->req).newurl);
        (data->req).newurl = (char *)0x0;
        req_buffer = Curl_add_buffer_init();
        if (req_buffer == (Curl_send_buffer *)0x0) {
LAB_00138e22:
          bVar23 = false;
          data = local_90;
          CVar11 = CURLE_OUT_OF_MEMORY;
        }
        else {
          pcVar18 = curl_maprintf("%s:%d",pcVar18,(ulong)uVar7);
          pcVar6 = local_a8;
          if (pcVar18 == (char *)0x0) {
            Curl_add_buffer_free(&req_buffer);
            goto LAB_00138e22;
          }
          CVar9 = Curl_http_output_auth(local_a8,"CONNECT",pcVar18,true);
          (*Curl_cfree)(pcVar18);
          pcVar18 = local_60;
          data = local_90;
          if (CVar9 == CURLE_OK) {
            pcVar22 = "1.1";
            if ((pcVar6->http_proxy).proxytype == CURLPROXY_HTTP_1_0) {
              pcVar22 = "1.0";
            }
            if ((pcVar6->host).name == local_60) {
              bVar23 = (bool)(((pcVar6->bits).field_0x5 & 4) >> 2);
            }
            else {
              pcVar15 = strchr(local_60,0x3a);
              bVar23 = pcVar15 != (char *)0x0;
            }
            pcVar15 = "";
            if (bVar23 != false) {
              pcVar15 = "[";
            }
            pcVar19 = "";
            if (bVar23 != false) {
              pcVar19 = "]";
            }
            pcVar18 = curl_maprintf("%s%s%s:%d",pcVar15,pcVar18,pcVar19,(ulong)local_7c);
            if (pcVar18 == (char *)0x0) {
              Curl_add_buffer_free(&req_buffer);
              CVar11 = CURLE_OUT_OF_MEMORY;
              bVar23 = false;
              CVar9 = CURLE_OK;
              data = local_90;
            }
            else {
              local_50 = pcVar22;
              pcVar22 = Curl_checkProxyheaders(pcVar6,"Host");
              if (pcVar22 == (char *)0x0) {
                pcVar22 = curl_maprintf("Host: %s\r\n");
                data = local_90;
                if (pcVar22 == (char *)0x0) {
                  (*Curl_cfree)(pcVar18);
                  Curl_add_buffer_free(&req_buffer);
                  CVar11 = CURLE_OUT_OF_MEMORY;
                  bVar23 = false;
                  CVar9 = CURLE_OK;
                  goto LAB_0013902d;
                }
              }
              else {
                pcVar22 = (char *)0x0;
              }
              data = local_90;
              pcVar6 = local_a8;
              local_88 = pcVar18;
              pcVar18 = Curl_checkProxyheaders(local_a8,"Proxy-Connection");
              pcVar15 = "";
              if (pcVar18 == (char *)0x0) {
                pcVar15 = "Proxy-Connection: Keep-Alive\r\n";
              }
              pcVar19 = Curl_checkProxyheaders(pcVar6,"User-Agent");
              pcVar18 = "";
              if ((pcVar19 == (char *)0x0) && (pcVar18 = "", (data->set).str[0x26] != (char *)0x0))
              {
                pcVar18 = (pcVar6->allocptr).uagent;
              }
              pcVar19 = pcVar22;
              if (pcVar22 == (char *)0x0) {
                pcVar19 = "";
              }
              pcVar21 = (pcVar6->allocptr).proxyuserpwd;
              if (pcVar21 == (char *)0x0) {
                pcVar21 = "";
              }
              CVar9 = Curl_add_bufferf(&req_buffer,"CONNECT %s HTTP/%s\r\n%s%s%s%s",local_88,
                                       local_50,pcVar19,pcVar21,pcVar18,pcVar15);
              if (pcVar22 != (char *)0x0) {
                (*Curl_cfree)(pcVar22);
              }
              (*Curl_cfree)(local_88);
              pcVar6 = local_a8;
              if (CVar9 == CURLE_OK) {
                CVar9 = Curl_add_custom_headers(local_a8,true,req_buffer);
              }
              if (CVar9 == CURLE_OK) {
                CVar9 = Curl_add_bufferf(&req_buffer,"\r\n");
              }
              if (CVar9 == CURLE_OK) {
                CVar9 = Curl_add_buffer_send(&req_buffer,pcVar6,local_48,0,local_94);
              }
              req_buffer = (Curl_send_buffer *)0x0;
              bVar23 = true;
              if (CVar9 != CURLE_OK) {
                Curl_failf(data,"Failed sending CONNECT to proxy");
              }
            }
LAB_0013902d:
            if (bVar23) goto LAB_00139031;
            bVar23 = false;
          }
          else {
LAB_00139031:
            Curl_add_buffer_free(&req_buffer);
            if (CVar9 == CURLE_OK) {
              phVar14->tunnel_state = TUNNEL_CONNECT;
              phVar14->perline = 0;
              bVar23 = true;
            }
            else {
              bVar23 = false;
              CVar11 = CVar9;
            }
          }
        }
        iVar10 = 1;
        conn = local_a8;
        if (bVar23) goto LAB_0013907c;
      }
      else {
LAB_0013907c:
        tVar16 = Curl_timeleft(data,(curltime *)0x0,true);
        if (tVar16 < 1) {
          Curl_failf(data,"Proxy CONNECT aborted due to timeout");
          CVar11 = CURLE_OPERATION_TIMEDOUT;
        }
        else {
          _Var8 = Curl_conn_data_pending(conn,local_94);
          if (_Var8) {
            bVar23 = false;
            if (phVar14->keepon != 0) {
              local_88 = (char *)((ulong)local_88 & 0xffffffff00000000);
              do {
                if (local_40 <= phVar14->ptr) {
                  Curl_failf(data,"CONNECT response too large!");
                  iVar10 = 1;
                  CVar9 = CURLE_RECV_ERROR;
                  goto LAB_00139819;
                }
                CVar9 = Curl_read(conn,local_70,phVar14->ptr,1,(ssize_t *)&req_buffer);
                lVar20 = 1;
                if ((CVar9 == CURLE_AGAIN) ||
                   (iVar10 = Curl_pgrsUpdate(conn), conn = local_a8, iVar10 != 0))
                goto LAB_0013913b;
                if (CVar9 != CURLE_OK) {
                  phVar14->keepon = 0;
                  break;
                }
                if ((long)req_buffer < 1) {
                  if (((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) {
                    Curl_failf(data,"Proxy CONNECT aborted");
                    local_88 = (char *)CONCAT44(local_88._4_4_,1);
                    phVar14->keepon = 0;
                  }
                  else {
                    puVar1 = &(local_a8->bits).field_0x7;
                    *puVar1 = *puVar1 | 1;
                    Curl_infof(data,"Proxy CONNECT connection closed\n");
                    phVar14->keepon = 0;
                  }
                  break;
                }
                if (phVar14->keepon < 2) {
                  size = (long)phVar14->perline + 1;
                  phVar14->perline = (int)size;
                  if (*phVar14->ptr == '\n') {
                    if (((data->set).field_0x8eb & 0x40) != 0) {
                      Curl_debug(data,CURLINFO_HEADER_IN,phVar14->line_start,size);
                    }
                    uVar4 = *(ulong *)&(data->set).field_0x8e8;
                    if (((uVar4 >> 0x31 & 1) == 0) &&
                       (CVar9 = Curl_client_write(conn,(((uint)uVar4 >> 0x19 & 1) != 0) + 2,
                                                  phVar14->line_start,(long)phVar14->perline),
                       CVar9 != CURLE_OK)) goto LAB_0013913b;
                    lVar17 = (long)phVar14->perline;
                    pcVar2 = &(data->info).header_size;
                    *pcVar2 = *pcVar2 + lVar17;
                    pcVar2 = &(data->req).headerbytecount;
                    *pcVar2 = *pcVar2 + lVar17;
                    cVar3 = *phVar14->line_start;
                    if ((cVar3 != '\r') && (cVar3 != '\n')) {
                      phVar14->line_start[lVar17] = '\0';
                      iVar10 = curl_strnequal("WWW-Authenticate:",phVar14->line_start,0x11);
                      if (((iVar10 == 0) || (*local_a0 != 0x191)) &&
                         ((iVar10 = curl_strnequal("Proxy-authenticate:",phVar14->line_start,0x13),
                          iVar10 == 0 || (*local_a0 != 0x197)))) {
                        iVar10 = curl_strnequal("Content-Length:",phVar14->line_start,0xf);
                        if (iVar10 == 0) {
                          _Var8 = Curl_compareheader(phVar14->line_start,"Connection:","close");
                          if (_Var8) {
LAB_001395b2:
                            phVar14->field_0x4024 = phVar14->field_0x4024 | 2;
                          }
                          else {
                            iVar10 = curl_strnequal("Transfer-Encoding:",phVar14->line_start,0x12);
                            if (iVar10 == 0) {
                              _Var8 = Curl_compareheader(phVar14->line_start,"Proxy-Connection:",
                                                         "close");
                              if (_Var8) goto LAB_001395b2;
                              iVar10 = __isoc99_sscanf(phVar14->line_start,"HTTP/1.%d %d",
                                                       &subversion,local_a0);
                              if (iVar10 == 2) {
                                (data->info).httpproxycode = (data->req).httpcode;
                              }
                            }
                            else {
                              if (*local_a0 - 200U < 100) {
                                pcVar18 = "Ignoring Transfer-Encoding in CONNECT %03d response\n";
                                goto LAB_0013951d;
                              }
                              _Var8 = Curl_compareheader(phVar14->line_start,"Transfer-Encoding:",
                                                         "chunked");
                              if (_Var8) {
                                Curl_infof(data,"CONNECT responded chunked\n");
                                phVar14->field_0x4024 = phVar14->field_0x4024 | 1;
                                Curl_httpchunk_init(conn);
                              }
                            }
                          }
                        }
                        else if (*local_a0 - 200U < 100) {
                          pcVar18 = "Ignoring Content-Length in CONNECT %03d response\n";
LAB_0013951d:
                          Curl_infof(data,pcVar18);
                        }
                        else {
                          curlx_strtoofft(phVar14->line_start + 0xf,(char **)0x0,10,local_78);
                        }
                      }
                      else {
                        iVar10 = *local_a0;
                        pcVar18 = Curl_copy_header_value(phVar14->line_start);
                        if (pcVar18 == (char *)0x0) {
                          bVar23 = false;
                        }
                        else {
                          CVar11 = Curl_http_input_auth(local_a8,iVar10 == 0x197,pcVar18);
                          (*Curl_cfree)(pcVar18);
                          bVar23 = CVar11 == CURLE_OK;
                        }
                        if (!bVar23) goto LAB_0013913b;
                      }
                      phVar14->perline = 0;
                      phVar14->ptr = phVar14->connect_buffer;
                      phVar14->line_start = phVar14->connect_buffer;
                      lVar20 = 0;
                      goto LAB_0013913b;
                    }
                    phVar14->ptr = phVar14->connect_buffer;
                    if ((*local_a0 == 0x197) && (((data->state).field_0x514 & 0x20) == 0)) {
                      phVar14->keepon = 2;
                      if (phVar14->cl == 0) {
                        if ((phVar14->field_0x4024 & 1) == 0) goto LAB_00139551;
                        Curl_infof(data,"Ignore chunked response-body\n");
                        puVar1 = &(data->req).field_0x570;
                        *puVar1 = *puVar1 | 8;
                        if (phVar14->line_start[1] == '\n') {
                          phVar14->line_start = phVar14->line_start + 1;
                        }
                        CVar12 = Curl_httpchunk_read(conn,phVar14->line_start + 1,1,
                                                     (ssize_t *)&req_buffer,(CURLcode *)&tookcareof)
                        ;
                        if (CVar12 == CHUNKE_STOP) {
                          Curl_infof(data,"chunk reading DONE\n");
                          phVar14->keepon = 0;
                          phVar14->tunnel_state = TUNNEL_COMPLETE;
                        }
                      }
                      else {
                        Curl_infof(data,"Ignore %ld bytes of response-body\n");
                      }
                    }
                    else {
LAB_00139551:
                      phVar14->keepon = 0;
                    }
                    lVar20 = 4;
                    if (*local_78 != 0) {
LAB_0013913b:
                      CVar11 = (*(code *)(&DAT_00157034 + *(int *)(&DAT_00157034 + lVar20 * 4)))();
                      return CVar11;
                    }
                    phVar14->tunnel_state = TUNNEL_COMPLETE;
                  }
                  else {
                    phVar14->ptr = phVar14->ptr + 1;
                  }
                }
                else {
                  phVar14->ptr = phVar14->connect_buffer;
                  lVar17 = phVar14->cl;
                  if (lVar17 != 0) {
                    *local_78 = lVar17 + -1;
                    lVar20 = 4;
                    if (1 < lVar17) goto LAB_0013913b;
                    phVar14->keepon = 0;
                    phVar14->tunnel_state = TUNNEL_COMPLETE;
                    break;
                  }
                  tookcareof = 0;
                  CVar12 = Curl_httpchunk_read(local_a8,phVar14->connect_buffer,1,&tookcareof,&extra
                                              );
                  if (CVar12 == CHUNKE_STOP) {
                    Curl_infof(data,"chunk reading DONE\n");
                    phVar14->keepon = 0;
                    phVar14->tunnel_state = TUNNEL_COMPLETE;
                  }
                }
              } while (phVar14->keepon != 0);
              bVar23 = (int)local_88 != 0;
            }
            iVar13 = Curl_pgrsUpdate(conn);
            CVar9 = CURLE_RECV_ERROR;
            if (iVar13 != 0) {
              CVar9 = CURLE_ABORTED_BY_CALLBACK;
            }
            iVar10 = 1;
            if (iVar13 == 0 && !bVar23) {
              if (99 < (data->info).httpproxycode - 200U) {
                CVar9 = Curl_http_auth_act(conn);
                if (CVar9 != CURLE_OK) goto LAB_00139819;
                if (((conn->bits).field_0x4 & 1) != 0) {
                  phVar14->field_0x4024 = phVar14->field_0x4024 | 2;
                }
              }
              lVar20 = local_68;
              iVar10 = 0;
              CVar9 = CVar11;
              if (((phVar14->field_0x4024 & 2) != 0) && ((data->req).newurl != (char *)0x0)) {
                Curl_closesocket(conn,conn->sock[local_68]);
                conn->sock[lVar20] = -1;
                iVar10 = 2;
              }
            }
LAB_00139819:
            CVar11 = CVar9;
            if (iVar10 == 0) {
              iVar10 = 0;
              if (((data->req).newurl != (char *)0x0) && (phVar14->tunnel_state == TUNNEL_COMPLETE))
              {
                phVar5 = conn->connect_state;
                phVar5->tunnel_state = TUNNEL_INIT;
                phVar5->keepon = 1;
                phVar5->line_start = phVar5->connect_buffer;
                phVar5->ptr = phVar5->connect_buffer;
                phVar5->cl = 0;
                phVar5->field_0x4024 = phVar5->field_0x4024 & 0xfd;
                iVar10 = 0;
              }
            }
            goto LAB_0013981d;
          }
          CVar11 = CURLE_OK;
        }
        iVar10 = 1;
      }
LAB_0013981d:
      if (iVar10 != 0) {
        if (iVar10 != 2) goto LAB_001399ef;
        break;
      }
    } while ((data->req).newurl != (char *)0x0);
    if ((data->info).httpproxycode - 200U < 100) {
      phVar14->tunnel_state = TUNNEL_COMPLETE;
      (*Curl_cfree)((conn->allocptr).proxyuserpwd);
      (conn->allocptr).proxyuserpwd = (char *)0x0;
      (data->state).authproxy.field_0x18 = ((data->state).authproxy.field_0x18 & 0xfc) + 1;
      CVar11 = CURLE_OK;
      Curl_infof(data,"Proxy replied %d to CONNECT request\n",
                 (ulong)(uint)(data->info).httpproxycode);
      puVar1 = &(data->req).field_0x570;
      *puVar1 = *puVar1 & 0xf7;
      puVar1 = &(conn->bits).field_0x6;
      *puVar1 = *puVar1 & 0xfd;
    }
    else {
      if (((phVar14->field_0x4024 & 2) == 0) || ((data->req).newurl == (char *)0x0)) {
        (*Curl_cfree)((data->req).newurl);
        (data->req).newurl = (char *)0x0;
        Curl_conncontrol(conn,2);
        lVar20 = local_68;
        Curl_closesocket(conn,conn->sock[local_68]);
        conn->sock[lVar20] = -1;
      }
      else {
        puVar1 = &(conn->bits).field_0x7;
        *puVar1 = *puVar1 | 1;
        Curl_infof(data,"Connect me again please\n");
        conn->connect_state->tunnel_state = TUNNEL_COMPLETE;
        Curl_infof(conn->data,"CONNECT phase completed!\n");
      }
      phVar14->tunnel_state = TUNNEL_INIT;
      CVar11 = CURLE_OK;
      if (((conn->bits).field_0x7 & 1) == 0) {
        Curl_failf(data,"Received HTTP code %d from proxy after CONNECT",
                   (ulong)(uint)(data->req).httpcode);
        CVar11 = CURLE_RECV_ERROR;
      }
    }
  }
LAB_001399ef:
  if (((CVar11 != CURLE_OK) || (conn->connect_state == (http_connect_state *)0x0)) ||
     (conn->connect_state->tunnel_state == TUNNEL_COMPLETE)) {
    conn->connect_state->tunnel_state = TUNNEL_COMPLETE;
    Curl_infof(conn->data,"CONNECT phase completed!\n");
  }
  return CVar11;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  if(!conn->connect_state) {
    result = connect_init(conn, FALSE);
    if(result)
      return result;
  }
  result = CONNECT(conn, sockindex, hostname, remote_port);

  if(result || Curl_connect_complete(conn))
    connect_done(conn);

  return result;
}